

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  float fVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *draw_list;
  ImGuiCol idx;
  bool bVar5;
  ImU32 IVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ImGuiTableColumn *pIVar10;
  int y;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 local_44;
  float local_3c;
  float local_38;
  float local_34;
  
  pIVar4 = table->InnerWindow;
  bVar5 = ImRect::Overlaps(&table->OuterWindow->ClipRect,&table->OuterRect);
  if (bVar5) {
    draw_list = pIVar4->DrawList;
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,draw_list,0);
    ImDrawList::PushClipRect
              (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false
              );
    fVar13 = (table->InnerRect).Min.y;
    fVar2 = (table->InnerRect).Max.y;
    fVar12 = fVar13;
    if (table->IsUsingHeaders == true) {
      fVar11 = fVar13;
      if (table->FreezeRowsCount < '\x01') {
        fVar11 = (table->WorkRect).Min.y;
      }
      fVar11 = fVar11 + table->LastFirstRowHeight;
      fVar12 = fVar2;
      if (fVar11 <= fVar2) {
        fVar12 = fVar11;
      }
    }
    uVar7 = table->Flags;
    if ((uVar7 >> 9 & 1) != 0) {
      local_38 = (float)(int)fVar13;
      uVar8 = 0;
      local_34 = fVar12;
      while ((long)uVar8 < (long)table->ColumnsCount) {
        if ((table->EnabledMaskByDisplayOrder >> (uVar8 & 0x3f) & 1) == 0) {
          uVar8 = uVar8 + 1;
        }
        else {
          cVar3 = (table->DisplayOrderToIndex).Data[uVar8];
          if (table->ResizedColumn == cVar3) {
            bVar5 = table->InstanceInteracted == table->InstanceCurrent;
          }
          else {
            bVar5 = false;
          }
          pIVar10 = (table->Columns).Data + cVar3;
          uVar8 = uVar8 + 1;
          fVar12 = pIVar10->MaxX;
          pIVar1 = &(table->InnerClipRect).Max;
          if ((((bool)((fVar12 < pIVar1->x || fVar12 == pIVar1->x) | bVar5)) &&
              (((pIVar10->NextEnabledColumn != -1 || ((pIVar10->Flags & 0x40000010U) == 0)) ||
               ((table->Flags & 0x1e000U) == 0x4000)))) && ((pIVar10->ClipRect).Min.x < fVar12)) {
            fVar12 = fVar2;
            if (((table->FreezeColumnsCount == -1 || uVar8 != (uint)(int)table->FreezeColumnsCount)
                && !bVar5) && table->HoveredColumnBorder != cVar3) {
              bVar5 = (table->Flags & 0x1800) == 0;
              if (!bVar5) {
                fVar12 = local_34;
              }
              IVar6 = table->RowBgColor[(ulong)bVar5 + 2];
            }
            else {
              if (bVar5) {
                idx = 0x1d;
              }
              else {
                if (table->HoveredColumnBorder != cVar3) {
                  IVar6 = table->BorderColorStrong;
                  goto LAB_0016c9f5;
                }
                idx = 0x1c;
              }
              IVar6 = GetColorU32(idx,1.0);
            }
LAB_0016c9f5:
            fVar11 = local_38;
            if (fVar13 < fVar12) {
              for (; local_3c = fVar12, (float)(int)fVar11 < local_3c;
                  fVar11 = (float)((int)fVar11 + 1)) {
                local_44.x = pIVar10->MaxX + -0.1;
                local_44.y = (float)(int)fVar11;
                ImDrawList::AddText(draw_list,&local_44,IVar6,"|",(char *)0x0);
                fVar12 = local_3c;
              }
            }
          }
        }
      }
      uVar7 = table->Flags;
    }
    if ((uVar7 & 0x500) != 0) {
      local_38 = (table->OuterRect).Min.x;
      fVar13 = (table->OuterRect).Min.y;
      fVar2 = (table->OuterRect).Max.x;
      fVar12 = (table->OuterRect).Max.y;
      IVar6 = table->BorderColorStrong;
      if ((uVar7 & 0x500) == 0x500) {
        for (iVar9 = (int)fVar13; fVar13 = (float)iVar9, fVar13 < fVar12; iVar9 = iVar9 + 1) {
          local_44.x = local_38;
          local_44.y = fVar13;
          local_3c = fVar13;
          ImDrawList::AddText(draw_list,&local_44,IVar6,"|",(char *)0x0);
          local_44.y = local_3c;
          local_44.x = fVar2 + -2.0;
          ImDrawList::AddText(draw_list,&local_44,IVar6,"|",(char *)0x0);
        }
      }
      else if ((uVar7 >> 10 & 1) != 0) {
        for (iVar9 = (int)fVar13; fVar13 = (float)iVar9, fVar13 < fVar12; iVar9 = iVar9 + 1) {
          local_44.x = local_38;
          local_44.y = fVar13;
          local_3c = fVar13;
          ImDrawList::AddText(draw_list,&local_44,IVar6,"|",(char *)0x0);
          local_44.y = local_3c;
          local_44.x = fVar2 + -2.0;
          ImDrawList::AddText(draw_list,&local_44,IVar6,"|",(char *)0x0);
        }
      }
    }
    ImDrawList::PopClipRect(draw_list);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter.SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1) {
                //inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2 - 1.0f), col, 0.1f);
                for (int y = draw_y1; y < draw_y2; ++y) {
                    inner_drawlist->AddText(ImVec2(column->MaxX - 0.1f, y), col, "|");
                }
            }
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            //inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH && false)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y && false)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}